

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialSurfaceSMC.cpp
# Opt level: O3

void __thiscall
chrono::ChMaterialSurfaceSMC::ArchiveIN(ChMaterialSurfaceSMC *this,ChArchiveIn *marchive)

{
  char *local_38;
  float *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChMaterialSurfaceSMC>(marchive);
  ChMaterialSurface::ArchiveIN(&this->super_ChMaterialSurface,marchive);
  local_30 = (float *)&(this->super_ChMaterialSurface).field_0x1c;
  local_38 = "young_modulus";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_38);
  local_30 = &this->poisson_ratio;
  local_38 = "poisson_ratio";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_38);
  local_30 = &this->constant_adhesion;
  local_38 = "constant_adhesion";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_38);
  local_30 = &this->adhesionMultDMT;
  local_38 = "adhesionMultDMT";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_38);
  local_30 = &this->adhesionSPerko;
  local_38 = "adhesionSPerko";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_38);
  local_30 = &this->kn;
  local_38 = "kn";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_38);
  local_30 = &this->kt;
  local_38 = "kt";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_38);
  local_30 = &this->gn;
  local_38 = "gn";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_38);
  local_30 = &this->gt;
  local_38 = "gt";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x28))(marchive,&local_38);
  return;
}

Assistant:

void ChMaterialSurfaceSMC::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChMaterialSurfaceSMC>();

    // deserialize parent class
    ChMaterialSurface::ArchiveIN(marchive);

    // stream in all member data:
    marchive >> CHNVP(young_modulus);
    marchive >> CHNVP(poisson_ratio);
    marchive >> CHNVP(constant_adhesion);
    marchive >> CHNVP(adhesionMultDMT);
    marchive >> CHNVP(adhesionSPerko);
    marchive >> CHNVP(kn);
    marchive >> CHNVP(kt);
    marchive >> CHNVP(gn);
    marchive >> CHNVP(gt);
}